

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.h
# Opt level: O0

void __thiscall cmDocumentation::RequestedHelpItem::~RequestedHelpItem(RequestedHelpItem *this)

{
  RequestedHelpItem *this_local;
  
  std::__cxx11::string::~string((string *)&this->Argument);
  std::__cxx11::string::~string((string *)&this->Filename);
  return;
}

Assistant:

RequestedHelpItem()
      : HelpType(None)
    {
    }